

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_26(QPDF *pdf,char *arg2)

{
  QPDFWriter local_180 [8];
  QPDFWriter w;
  QPDFObjectHandle local_170;
  QPDFObjectHandle local_160;
  allocator<char> local_149;
  string local_148 [32];
  QPDFObjectHandle local_128;
  QPDFObjectHandle local_118;
  QPDFPageObjectHelper local_108;
  QPDFPageDocumentHelper local_d0;
  allocator<char> local_a9;
  string local_a8 [32];
  undefined1 local_88 [8];
  QPDFObjectHandle O3;
  string local_70 [32];
  QPDFObjectHandle local_50;
  undefined1 local_40 [8];
  QPDFObjectHandle qtest;
  QPDF local_20 [8];
  QPDF oldpdf;
  char *arg2_local;
  QPDF *pdf_local;
  
  _oldpdf = arg2;
  if (arg2 != (char *)0x0) {
    QPDF::QPDF(local_20);
    QPDF::processFile((char *)local_20,_oldpdf);
    QPDF::getTrailer();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_70,"/QTest",
               (allocator<char> *)
               ((long)&O3.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey((string *)local_40);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&O3.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::~QPDFObjectHandle(&local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a8,"/O3",&local_a9);
    QPDFObjectHandle::getKey((string *)local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_d0,pdf);
    QPDFObjectHandle::QPDFObjectHandle(&local_118,(QPDFObjectHandle *)local_88);
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_108,(QPDFObjectHandle *)&local_118);
    QPDFPageDocumentHelper::addPage((QPDFPageObjectHelper *)&local_d0,SUB81(&local_108,0));
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_108);
    QPDFObjectHandle::~QPDFObjectHandle(&local_118);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_d0);
    QPDF::getTrailer();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_148,"/QTest",&local_149);
    QPDFObjectHandle::QPDFObjectHandle(&local_170,(QPDFObjectHandle *)local_40);
    QPDF::copyForeignObject((QPDFObjectHandle *)&local_160);
    QPDFObjectHandle::replaceKey((string *)&local_128,(QPDFObjectHandle *)local_148);
    QPDFObjectHandle::~QPDFObjectHandle(&local_160);
    QPDFObjectHandle::~QPDFObjectHandle(&local_170);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
    QPDFObjectHandle::~QPDFObjectHandle(&local_128);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_88);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
    QPDF::~QPDF(local_20);
    QPDFWriter::QPDFWriter(local_180,pdf,"a.pdf");
    QPDFWriter::setStaticID(SUB81(local_180,0));
    QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_180);
    QPDFWriter::write();
    QPDFWriter::~QPDFWriter(local_180);
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x3d8,"void test_26(QPDF &, const char *)");
}

Assistant:

static void
test_26(QPDF& pdf, char const* arg2)
{
    // Copy the O3 page using addPage.  Copy qtest without
    // crossing page boundaries.  In addition to previous results,
    // should get page O3 but no other pages including the page
    // that O3 points to.  Also, inherited object will have been
    // pushed down and will be preserved.

    {
        // Make sure original PDF is out of scope when we write.
        assert(arg2 != nullptr);
        QPDF oldpdf;
        oldpdf.processFile(arg2);
        QPDFObjectHandle qtest = oldpdf.getTrailer().getKey("/QTest");
        QPDFObjectHandle O3 = qtest.getKey("/O3");
        QPDFPageDocumentHelper(pdf).addPage(O3, false);
        pdf.getTrailer().replaceKey("/QTest", pdf.copyForeignObject(qtest));
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}